

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBox.cpp
# Opt level: O3

CPoint * __thiscall CBBox::GetCenter(CPoint *__return_storage_ptr__,CBBox *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  
  sVar1 = this->m_iMinX;
  sVar2 = this->m_iMaxX;
  sVar3 = this->m_iMinY;
  sVar4 = this->m_iMaxY;
  sVar5 = (short)this->m_cMaxZ + (short)this->m_cMinZ;
  CPoint::CPoint(__return_storage_ptr__);
  CPoint::Initialize(__return_storage_ptr__,((int)sVar2 + (int)sVar1) / 2,
                     ((int)sVar4 + (int)sVar3) / 2,(int)(short)(sVar5 - (sVar5 >> 0xf)) >> 1,
                     (CWire *)0x0);
  return __return_storage_ptr__;
}

Assistant:

CPoint CBBox::GetCenter()
{
	int	iX	=	(m_iMinX+m_iMaxX)/2;
	int	iY	=	(m_iMinY+m_iMaxY)/2;
	int	iZ	=	(m_cMinZ+m_cMaxZ)/2;

	CPoint	Ret;
	Ret.Initialize(iX,iY,iZ,NULL);

	return	Ret;
}